

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx::DiscMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  uint uVar27;
  undefined4 uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar41;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar50 [32];
  float fVar51;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar52 [32];
  float fVar59;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar69 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  Primitive *local_2b8;
  RTCFilterFunctionNArguments local_2b0;
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar6 = context->scene;
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  lVar31 = *(long *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar29 = (Disc->primIDs).field_0.i[4] * _Var8;
  auVar34._16_16_ = *(undefined1 (*) [16])(lVar31 + lVar29);
  auVar34._0_16_ = *(undefined1 (*) [16])(lVar31 + (Disc->primIDs).field_0.i[0] * _Var8);
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar31 + (Disc->primIDs).field_0.i[5] * _Var8);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar31 + (Disc->primIDs).field_0.i[1] * _Var8);
  auVar40._16_16_ = *(undefined1 (*) [16])(lVar31 + (Disc->primIDs).field_0.i[6] * _Var8);
  auVar40._0_16_ = *(undefined1 (*) [16])(lVar31 + (Disc->primIDs).field_0.i[2] * _Var8);
  auVar42._16_16_ = *(undefined1 (*) [16])(lVar31 + (Disc->primIDs).field_0.i[7] * _Var8);
  auVar42._0_16_ = *(undefined1 (*) [16])(lVar31 + (Disc->primIDs).field_0.i[3] * _Var8);
  auVar35 = vunpcklps_avx(auVar34,auVar40);
  auVar12 = vunpckhps_avx(auVar34,auVar40);
  auVar13 = vunpcklps_avx(auVar38,auVar42);
  auVar42 = vunpckhps_avx(auVar38,auVar42);
  auVar34 = vunpcklps_avx(auVar35,auVar13);
  auVar13 = vunpckhps_avx(auVar35,auVar13);
  auVar40 = vunpcklps_avx(auVar12,auVar42);
  local_250 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_260 = local_250;
  uVar28 = *(undefined4 *)(ray + k * 4);
  auVar35._4_4_ = uVar28;
  auVar35._0_4_ = uVar28;
  auVar35._8_4_ = uVar28;
  auVar35._12_4_ = uVar28;
  auVar35._16_4_ = uVar28;
  auVar35._20_4_ = uVar28;
  auVar35._24_4_ = uVar28;
  auVar35._28_4_ = uVar28;
  auVar34 = vsubps_avx(auVar34,auVar35);
  uVar28 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar60._4_4_ = uVar28;
  auVar60._0_4_ = uVar28;
  auVar60._8_4_ = uVar28;
  auVar60._12_4_ = uVar28;
  auVar60._16_4_ = uVar28;
  auVar60._20_4_ = uVar28;
  auVar60._24_4_ = uVar28;
  auVar60._28_4_ = uVar28;
  uVar28 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar76._4_4_ = uVar28;
  auVar76._0_4_ = uVar28;
  auVar76._8_4_ = uVar28;
  auVar76._12_4_ = uVar28;
  auVar76._16_4_ = uVar28;
  auVar76._20_4_ = uVar28;
  auVar76._24_4_ = uVar28;
  auVar76._28_4_ = uVar28;
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar79 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar80._16_16_ = auVar79;
  auVar80._0_16_ = auVar79;
  auVar35 = vrcpps_avx(auVar80);
  auVar38 = vsubps_avx(auVar13,auVar60);
  auVar40 = vsubps_avx(auVar40,auVar76);
  auVar52._8_4_ = 0x3f800000;
  auVar52._0_8_ = &DAT_3f8000003f800000;
  auVar52._12_4_ = 0x3f800000;
  auVar52._16_4_ = 0x3f800000;
  auVar52._20_4_ = 0x3f800000;
  auVar52._24_4_ = 0x3f800000;
  auVar52._28_4_ = 0x3f800000;
  fVar51 = auVar35._0_4_;
  fVar53 = auVar35._4_4_;
  auVar13._4_4_ = fVar53 * auVar79._4_4_;
  auVar13._0_4_ = fVar51 * auVar79._0_4_;
  fVar54 = auVar35._8_4_;
  auVar13._8_4_ = fVar54 * auVar79._8_4_;
  fVar55 = auVar35._12_4_;
  auVar13._12_4_ = fVar55 * auVar79._12_4_;
  fVar56 = auVar35._16_4_;
  auVar13._16_4_ = fVar56 * auVar79._0_4_;
  fVar57 = auVar35._20_4_;
  auVar13._20_4_ = fVar57 * auVar79._4_4_;
  fVar58 = auVar35._24_4_;
  auVar13._24_4_ = fVar58 * auVar79._8_4_;
  auVar13._28_4_ = uVar28;
  auVar13 = vsubps_avx(auVar52,auVar13);
  fVar68 = auVar40._0_4_;
  fVar70 = auVar40._4_4_;
  fVar71 = auVar40._8_4_;
  fVar72 = auVar40._12_4_;
  fVar73 = auVar40._16_4_;
  fVar74 = auVar40._20_4_;
  fVar75 = auVar40._24_4_;
  fVar59 = auVar38._0_4_;
  fVar62 = auVar38._4_4_;
  fVar63 = auVar38._8_4_;
  fVar64 = auVar38._12_4_;
  fVar65 = auVar38._16_4_;
  fVar66 = auVar38._20_4_;
  fVar67 = auVar38._24_4_;
  fVar41 = auVar34._0_4_;
  fVar44 = auVar34._4_4_;
  fVar45 = auVar34._8_4_;
  fVar46 = auVar34._12_4_;
  fVar47 = auVar34._16_4_;
  fVar48 = auVar34._20_4_;
  fVar49 = auVar34._24_4_;
  fVar51 = (fVar41 * fVar1 + fVar59 * fVar2 + fVar68 * fVar3) * (fVar51 + fVar51 * auVar13._0_4_);
  fVar53 = (fVar44 * fVar1 + fVar62 * fVar2 + fVar70 * fVar3) * (fVar53 + fVar53 * auVar13._4_4_);
  local_200._4_4_ = fVar53;
  local_200._0_4_ = fVar51;
  fVar54 = (fVar45 * fVar1 + fVar63 * fVar2 + fVar71 * fVar3) * (fVar54 + fVar54 * auVar13._8_4_);
  local_200._8_4_ = fVar54;
  fVar55 = (fVar46 * fVar1 + fVar64 * fVar2 + fVar72 * fVar3) * (fVar55 + fVar55 * auVar13._12_4_);
  local_200._12_4_ = fVar55;
  fVar56 = (fVar47 * fVar1 + fVar65 * fVar2 + fVar73 * fVar3) * (fVar56 + fVar56 * auVar13._16_4_);
  local_200._16_4_ = fVar56;
  fVar57 = (fVar48 * fVar1 + fVar66 * fVar2 + fVar74 * fVar3) * (fVar57 + fVar57 * auVar13._20_4_);
  local_200._20_4_ = fVar57;
  fVar58 = (fVar49 * fVar1 + fVar67 * fVar2 + fVar75 * fVar3) * (fVar58 + fVar58 * auVar13._24_4_);
  local_200._24_4_ = fVar58;
  local_200._28_4_ = auVar35._28_4_ + auVar13._28_4_;
  uVar28 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar77._4_4_ = uVar28;
  auVar77._0_4_ = uVar28;
  auVar77._8_4_ = uVar28;
  auVar77._12_4_ = uVar28;
  auVar77._16_4_ = uVar28;
  auVar77._20_4_ = uVar28;
  auVar77._24_4_ = uVar28;
  auVar77._28_4_ = uVar28;
  auVar35 = vcmpps_avx(auVar77,local_200,2);
  uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar81._4_4_ = uVar28;
  auVar81._0_4_ = uVar28;
  auVar81._8_4_ = uVar28;
  auVar81._12_4_ = uVar28;
  auVar81._16_4_ = uVar28;
  auVar81._20_4_ = uVar28;
  auVar81._24_4_ = uVar28;
  auVar81._28_4_ = uVar28;
  auVar13 = vcmpps_avx(local_200,auVar81,2);
  auVar35 = vandps_avx(auVar35,auVar13);
  auVar79 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar82._16_16_ = auVar79;
  auVar82._0_16_ = auVar79;
  auVar13 = vcvtdq2ps_avx(auVar82);
  auVar13 = vcmpps_avx(_DAT_02020f40,auVar13,1);
  auVar52 = auVar13 & auVar35;
  if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar52 >> 0x7f,0) != '\0') ||
        (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar52 >> 0xbf,0) != '\0') ||
      (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar52[0x1f] < '\0') {
    auVar35 = vandps_avx(auVar35,auVar13);
    auVar52 = vunpckhps_avx(auVar12,auVar42);
    auVar12._4_4_ = fVar1 * fVar53;
    auVar12._0_4_ = fVar1 * fVar51;
    auVar12._8_4_ = fVar1 * fVar54;
    auVar12._12_4_ = fVar1 * fVar55;
    auVar12._16_4_ = fVar1 * fVar56;
    auVar12._20_4_ = fVar1 * fVar57;
    auVar12._24_4_ = fVar1 * fVar58;
    auVar12._28_4_ = auVar42._28_4_;
    auVar14._4_4_ = fVar2 * fVar53;
    auVar14._0_4_ = fVar2 * fVar51;
    auVar14._8_4_ = fVar2 * fVar54;
    auVar14._12_4_ = fVar2 * fVar55;
    auVar14._16_4_ = fVar2 * fVar56;
    auVar14._20_4_ = fVar2 * fVar57;
    auVar14._24_4_ = fVar2 * fVar58;
    auVar14._28_4_ = auVar13._28_4_;
    auVar26._4_4_ = fVar3 * fVar53;
    auVar26._0_4_ = fVar3 * fVar51;
    auVar26._8_4_ = fVar3 * fVar54;
    auVar26._12_4_ = fVar3 * fVar55;
    auVar26._16_4_ = fVar3 * fVar56;
    auVar26._20_4_ = fVar3 * fVar57;
    auVar26._24_4_ = fVar3 * fVar58;
    auVar26._28_4_ = DAT_02020f40._28_4_;
    auVar13 = vsubps_avx(auVar34,auVar12);
    auVar12 = vsubps_avx(auVar38,auVar14);
    auVar42 = vsubps_avx(auVar40,auVar26);
    auVar50._0_4_ =
         auVar12._0_4_ * auVar12._0_4_ + auVar42._0_4_ * auVar42._0_4_ +
         auVar13._0_4_ * auVar13._0_4_;
    auVar50._4_4_ =
         auVar12._4_4_ * auVar12._4_4_ + auVar42._4_4_ * auVar42._4_4_ +
         auVar13._4_4_ * auVar13._4_4_;
    auVar50._8_4_ =
         auVar12._8_4_ * auVar12._8_4_ + auVar42._8_4_ * auVar42._8_4_ +
         auVar13._8_4_ * auVar13._8_4_;
    auVar50._12_4_ =
         auVar12._12_4_ * auVar12._12_4_ + auVar42._12_4_ * auVar42._12_4_ +
         auVar13._12_4_ * auVar13._12_4_;
    auVar50._16_4_ =
         auVar12._16_4_ * auVar12._16_4_ + auVar42._16_4_ * auVar42._16_4_ +
         auVar13._16_4_ * auVar13._16_4_;
    auVar50._20_4_ =
         auVar12._20_4_ * auVar12._20_4_ + auVar42._20_4_ * auVar42._20_4_ +
         auVar13._20_4_ * auVar13._20_4_;
    auVar50._24_4_ =
         auVar12._24_4_ * auVar12._24_4_ + auVar42._24_4_ * auVar42._24_4_ +
         auVar13._24_4_ * auVar13._24_4_;
    auVar50._28_4_ = auVar12._28_4_ + auVar42._28_4_ + auVar13._28_4_;
    auVar15._4_4_ = auVar52._4_4_ * auVar52._4_4_;
    auVar15._0_4_ = auVar52._0_4_ * auVar52._0_4_;
    auVar15._8_4_ = auVar52._8_4_ * auVar52._8_4_;
    auVar15._12_4_ = auVar52._12_4_ * auVar52._12_4_;
    auVar15._16_4_ = auVar52._16_4_ * auVar52._16_4_;
    auVar15._20_4_ = auVar52._20_4_ * auVar52._20_4_;
    auVar15._24_4_ = auVar52._24_4_ * auVar52._24_4_;
    auVar15._28_4_ = auVar52._28_4_;
    auVar13 = vcmpps_avx(auVar50,auVar15,2);
    auVar12 = auVar35 & auVar13;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar35 = vandps_avx(auVar35,auVar13);
      auVar43._0_4_ = fVar41 * fVar41 + fVar68 * fVar68 + fVar59 * fVar59;
      auVar43._4_4_ = fVar44 * fVar44 + fVar70 * fVar70 + fVar62 * fVar62;
      auVar43._8_4_ = fVar45 * fVar45 + fVar71 * fVar71 + fVar63 * fVar63;
      auVar43._12_4_ = fVar46 * fVar46 + fVar72 * fVar72 + fVar64 * fVar64;
      auVar43._16_4_ = fVar47 * fVar47 + fVar73 * fVar73 + fVar65 * fVar65;
      auVar43._20_4_ = fVar48 * fVar48 + fVar74 * fVar74 + fVar66 * fVar66;
      auVar43._24_4_ = fVar49 * fVar49 + fVar75 * fVar75 + fVar67 * fVar67;
      auVar43._28_4_ = auVar34._28_4_ + auVar40._28_4_ + auVar38._28_4_;
      auVar13 = vcmpps_avx(auVar43,auVar15,6);
      auVar34 = auVar35 & auVar13;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0x7f,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0xbf,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar34[0x1f] < '\0') {
        auVar35 = vandps_avx(auVar13,auVar35);
        local_1e0._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
        local_1e0._8_4_ = -fVar1;
        local_1e0._12_4_ = -fVar1;
        local_1e0._16_4_ = -fVar1;
        local_1e0._20_4_ = -fVar1;
        local_1e0._24_4_ = -fVar1;
        local_1e0._28_4_ = -fVar1;
        local_1a0._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_1a0._8_4_ = -fVar3;
        local_1a0._12_4_ = -fVar3;
        local_1a0._16_4_ = -fVar3;
        local_1a0._20_4_ = -fVar3;
        local_1a0._24_4_ = -fVar3;
        local_1a0._28_4_ = -fVar3;
        local_220 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_240 = local_220;
        local_1c0[0] = -fVar2;
        local_1c0[1] = -fVar2;
        local_1c0[2] = -fVar2;
        local_1c0[3] = -fVar2;
        fStack_1b0 = -fVar2;
        fStack_1ac = -fVar2;
        fStack_1a8 = -fVar2;
        fStack_1a4 = -fVar2;
        uVar28 = vmovmskps_avx(auVar35);
        uVar30 = CONCAT44((int)((ulong)lVar29 >> 0x20),uVar28);
        uVar27 = 1 << ((byte)k & 0x1f);
        uVar32 = (ulong)((uVar27 & 0xf) << 4);
        lVar31 = (long)((int)uVar27 >> 4) * 0x10;
        auVar35 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar35 = vcmpps_avx(auVar35,auVar35,0xf);
        auVar61 = ZEXT3264(auVar35);
        auVar69 = ZEXT464(0) << 0x20;
        auVar78 = ZEXT3264(CONCAT428(0xff800000,
                                     CONCAT424(0xff800000,
                                               CONCAT420(0xff800000,
                                                         CONCAT416(0xff800000,
                                                                   CONCAT412(0xff800000,
                                                                             CONCAT48(0xff800000,
                                                                                                                                                                            
                                                  0xff800000ff800000)))))));
        do {
          local_2b0.valid = (int *)&local_2e0;
          uVar10 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar27 = *(uint *)(local_260 + uVar10 * 4);
          pGVar7 = (pSVar6->geometries).items[uVar27].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            uVar30 = uVar30 ^ 1L << (uVar10 & 0x3f);
            bVar33 = true;
          }
          else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                  (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            bVar33 = false;
          }
          else {
            uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
            local_120 = *(undefined4 *)(local_240 + uVar10 * 4);
            uVar4 = *(undefined4 *)(local_220 + uVar10 * 4);
            local_100._4_4_ = uVar4;
            local_100._0_4_ = uVar4;
            local_100._8_4_ = uVar4;
            local_100._12_4_ = uVar4;
            local_100._16_4_ = uVar4;
            local_100._20_4_ = uVar4;
            local_100._24_4_ = uVar4;
            local_100._28_4_ = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar10 * 4);
            local_2b0.context = context->user;
            uVar5 = (Disc->primIDs).field_0.i[uVar10];
            local_e0._4_4_ = uVar5;
            local_e0._0_4_ = uVar5;
            local_e0._8_4_ = uVar5;
            local_e0._12_4_ = uVar5;
            local_e0._16_4_ = uVar5;
            local_e0._20_4_ = uVar5;
            local_e0._24_4_ = uVar5;
            local_e0._28_4_ = uVar5;
            fVar1 = local_1c0[uVar10 - 8];
            fVar2 = local_1c0[uVar10];
            local_160._4_4_ = fVar2;
            local_160._0_4_ = fVar2;
            local_160._8_4_ = fVar2;
            local_160._12_4_ = fVar2;
            local_160._16_4_ = fVar2;
            local_160._20_4_ = fVar2;
            local_160._24_4_ = fVar2;
            local_160._28_4_ = fVar2;
            local_b0 = vpshufd_avx(ZEXT416(uVar27),0);
            uVar4 = *(undefined4 *)(local_1a0 + uVar10 * 4);
            local_140._4_4_ = uVar4;
            local_140._0_4_ = uVar4;
            local_140._8_4_ = uVar4;
            local_140._12_4_ = uVar4;
            local_140._16_4_ = uVar4;
            local_140._20_4_ = uVar4;
            local_140._24_4_ = uVar4;
            local_140._28_4_ = uVar4;
            local_180[0] = (RTCHitN)SUB41(fVar1,0);
            local_180[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[4] = (RTCHitN)SUB41(fVar1,0);
            local_180[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[8] = (RTCHitN)SUB41(fVar1,0);
            local_180[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0xc] = (RTCHitN)SUB41(fVar1,0);
            local_180[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x10] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x11] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x12] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x13] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x14] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x15] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x16] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x17] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x18] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x19] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x1a] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x1b] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x1c] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x1d] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x1e] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x1f] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            local_c0 = local_b0;
            local_280 = auVar61._0_32_;
            uStack_9c = (local_2b0.context)->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = (local_2b0.context)->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            local_2e0 = *(undefined8 *)(mm_lookupmask_ps + uVar32);
            uStack_2d8 = *(undefined8 *)(mm_lookupmask_ps + uVar32 + 8);
            local_2d0 = *(undefined8 *)(mm_lookupmask_ps + lVar31);
            uStack_2c8 = *(undefined8 *)(mm_lookupmask_ps + lVar31 + 8);
            local_2b0.geometryUserPtr = pGVar7->userPtr;
            local_2b0.hit = local_180;
            local_2b0.N = 8;
            local_2b0.ray = (RTCRayN *)ray;
            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              local_2b8 = Disc;
              (*pGVar7->occlusionFilterN)(&local_2b0);
              auVar78 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar61 = ZEXT3264(local_280);
              Disc = local_2b8;
            }
            auVar79._8_8_ = uStack_2d8;
            auVar79._0_8_ = local_2e0;
            auVar79 = vpcmpeqd_avx(auVar69._0_16_,auVar79);
            auVar11._8_8_ = uStack_2c8;
            auVar11._0_8_ = local_2d0;
            auVar11 = vpcmpeqd_avx(auVar69._0_16_,auVar11);
            auVar36._16_16_ = auVar11;
            auVar36._0_16_ = auVar79;
            local_280 = auVar61._0_32_;
            auVar35 = local_280 & ~auVar36;
            if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar35 >> 0x7f,0) == '\0') &&
                  (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar35 >> 0xbf,0) == '\0') &&
                (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar35[0x1f]) {
              auVar37._0_4_ = auVar79._0_4_ ^ auVar61._0_4_;
              auVar37._4_4_ = auVar79._4_4_ ^ auVar61._4_4_;
              auVar37._8_4_ = auVar79._8_4_ ^ auVar61._8_4_;
              auVar37._12_4_ = auVar79._12_4_ ^ auVar61._12_4_;
              auVar37._16_4_ = auVar11._0_4_ ^ auVar61._16_4_;
              auVar37._20_4_ = auVar11._4_4_ ^ auVar61._20_4_;
              auVar37._24_4_ = auVar11._8_4_ ^ auVar61._24_4_;
              auVar37._28_4_ = auVar11._12_4_ ^ auVar61._28_4_;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var9)(&local_2b0);
                auVar78 = ZEXT3264(CONCAT428(0xff800000,
                                             CONCAT424(0xff800000,
                                                       CONCAT420(0xff800000,
                                                                 CONCAT416(0xff800000,
                                                                           CONCAT412(0xff800000,
                                                                                     CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
                auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar61 = ZEXT3264(local_280);
              }
              auVar24._8_8_ = uStack_2d8;
              auVar24._0_8_ = local_2e0;
              auVar79 = vpcmpeqd_avx(auVar69._0_16_,auVar24);
              auVar25._8_8_ = uStack_2c8;
              auVar25._0_8_ = local_2d0;
              auVar11 = vpcmpeqd_avx(auVar69._0_16_,auVar25);
              auVar39._16_16_ = auVar11;
              auVar39._0_16_ = auVar79;
              auVar37._0_4_ = auVar79._0_4_ ^ auVar61._0_4_;
              auVar37._4_4_ = auVar79._4_4_ ^ auVar61._4_4_;
              auVar37._8_4_ = auVar79._8_4_ ^ auVar61._8_4_;
              auVar37._12_4_ = auVar79._12_4_ ^ auVar61._12_4_;
              auVar37._16_4_ = auVar11._0_4_ ^ auVar61._16_4_;
              auVar37._20_4_ = auVar11._4_4_ ^ auVar61._20_4_;
              auVar37._24_4_ = auVar11._8_4_ ^ auVar61._24_4_;
              auVar37._28_4_ = auVar11._12_4_ ^ auVar61._28_4_;
              auVar35 = vblendvps_avx(auVar78._0_32_,*(undefined1 (*) [32])(local_2b0.ray + 0x100),
                                      auVar39);
              *(undefined1 (*) [32])(local_2b0.ray + 0x100) = auVar35;
            }
            bVar22 = (auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
            bVar23 = (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
            bVar21 = (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
            bVar20 = SUB321(auVar37 >> 0x7f,0) == '\0';
            bVar19 = (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
            bVar18 = SUB321(auVar37 >> 0xbf,0) == '\0';
            bVar17 = (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
            bVar16 = -1 < auVar37[0x1f];
            bVar33 = ((((((bVar22 && bVar23) && bVar21) && bVar20) && bVar19) && bVar18) && bVar17)
                     && bVar16;
            if (((((((bVar22 && bVar23) && bVar21) && bVar20) && bVar19) && bVar18) && bVar17) &&
                bVar16) {
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar28;
              uVar30 = uVar30 ^ 1L << (uVar10 & 0x3f);
            }
          }
        } while ((bVar33 != false) && (uVar30 != 0));
        return (bool)(bVar33 ^ 1);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }